

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::updateScale<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double qcurr,double qprev,double eprev1,double eprev2,
               double epsilon)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  SSVectorBase<double> *pSVar6;
  
  SSVectorBase<double>::operator-=(*pscprev,*psccurr);
  pSVar6 = *pscprev;
  if (ABS(-eprev1 * eprev2) <= epsilon) {
    SSVectorBase<double>::clear(pSVar6);
  }
  else {
    lVar4 = (long)(pSVar6->super_IdxSet).num;
    if (0 < lVar4) {
      piVar2 = (pSVar6->super_IdxSet).idx;
      pdVar3 = (pSVar6->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar5 = lVar4 + 1;
      do {
        iVar1 = piVar2[uVar5 - 2];
        pdVar3[iVar1] = pdVar3[iVar1] * -eprev1 * eprev2;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  pSVar6 = SSVectorBase<double>::assignPWproduct4setup<double,double>(tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<double>::operator+=(*pscprev,pSVar6);
  pSVar6 = *pscprev;
  lVar4 = (long)(pSVar6->super_IdxSet).num;
  if (0 < lVar4) {
    piVar2 = (pSVar6->super_IdxSet).idx;
    pdVar3 = (pSVar6->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar5 = lVar4 + 1;
    do {
      iVar1 = piVar2[uVar5 - 2];
      pdVar3[iVar1] = pdVar3[iVar1] * (1.0 / (qcurr * qprev));
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  SSVectorBase<double>::operator+=(pSVar6,*psccurr);
  pSVar6 = *psccurr;
  *psccurr = *pscprev;
  *pscprev = pSVar6;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}